

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O0

void LDSketch_get_heavy_keys(LDSketch_t *sk,longlong thresh,uchar *keys,longlong *vals,int *num_key)

{
  int iVar1;
  size_t size;
  size_t nmemb;
  void *pvVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  int *in_R8;
  longlong v;
  int k;
  int j;
  int i_1;
  int n;
  int tmp_n;
  uchar *tmp_keys;
  int len;
  int i;
  int max_array_len;
  char *in_stack_ffffffffffffff50;
  allocator *num_key_00;
  LDSketch_t *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int iVar3;
  int iVar4;
  int local_78;
  allocator local_61;
  string local_60 [32];
  void *local_40;
  int local_34;
  int local_30;
  int local_2c;
  int *local_28;
  long local_20;
  long local_18;
  long local_10;
  long *local_8;
  
  local_2c = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_30 = 0; local_30 < *(int *)((long)local_8 + 0xc) * (int)local_8[1];
      local_30 = local_30 + 1) {
    if ((local_10 <= *(long *)(*(long *)(*local_8 + (long)local_30 * 8) + 0x50)) &&
       (local_34 = dyn_tbl_length((dyn_tbl_t *)0x1074ec), local_2c < local_34)) {
      local_2c = local_34;
    }
  }
  size = (size_t)local_2c;
  iVar4 = *(int *)((long)local_8 + 0x14);
  if (iVar4 < 0) {
    iVar4 = iVar4 + 7;
  }
  nmemb = (size_t)(iVar4 >> 3);
  num_key_00 = &local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"tmp heavy keys",num_key_00);
  std::__cxx11::string::c_str();
  pvVar2 = safe_calloc(nmemb,size,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  iVar4 = 0;
  iVar3 = 0;
  local_40 = pvVar2;
  do {
    if (*(int *)((long)local_8 + 0xc) * (int)local_8[1] <= iVar3) {
      *local_28 = iVar4;
      return;
    }
    if (local_10 <= *(long *)(*(long *)(*local_8 + (long)iVar3 * 8) + 0x50)) {
      dyn_tbl_get_heavy_key
                ((dyn_tbl_t *)CONCAT44(iVar4,iVar3),
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (uchar *)in_stack_ffffffffffffff70,(int *)num_key_00);
      for (in_stack_ffffffffffffff7c = 0; in_stack_ffffffffffffff7c < local_78;
          in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1) {
        in_stack_ffffffffffffff78 = 0;
        while ((in_stack_ffffffffffffff78 < iVar4 &&
               (iVar1 = memcmp((void *)((long)local_40 +
                                       (long)((in_stack_ffffffffffffff7c *
                                              *(int *)((long)local_8 + 0x14)) / 8)),
                               (void *)(local_18 +
                                       (in_stack_ffffffffffffff78 * *(int *)((long)local_8 + 0x14))
                                       / 8),(long)(*(int *)((long)local_8 + 0x14) / 8)), iVar1 != 0)
               )) {
          in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 + 1;
        }
        if (in_stack_ffffffffffffff78 < iVar4) break;
        in_stack_ffffffffffffff70 =
             (LDSketch_t *)LDSketch_up_estimate(in_stack_ffffffffffffff70,(uchar *)num_key_00);
        if (local_10 <= (long)in_stack_ffffffffffffff70) {
          memcpy((void *)(local_18 + (iVar4 * *(int *)((long)local_8 + 0x14)) / 8),
                 (void *)((long)local_40 +
                         (long)((in_stack_ffffffffffffff7c * *(int *)((long)local_8 + 0x14)) / 8)),
                 (long)(*(int *)((long)local_8 + 0x14) / 8));
          *(LDSketch_t **)(local_20 + (long)iVar4 * 8) = in_stack_ffffffffffffff70;
          iVar4 = iVar4 + 1;
        }
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void LDSketch_get_heavy_keys(LDSketch_t* sk, long long thresh,
	unsigned char* keys, long long* vals,
	int* num_key) {
	int max_array_len = 0;
	for (int i = 0; i < sk->w * sk->h; ++i) {
		if (sk->tbl[i]->max_value >= thresh) {
			int len = dyn_tbl_length(sk->tbl[i]);
			if (len > max_array_len) {
				max_array_len = len;
			}
		}
	}

	unsigned char* tmp_keys = (unsigned char*)safe_calloc(
		max_array_len, sk->lgn / 8, std::string("tmp heavy keys").c_str());
	int tmp_n, n = 0;

	for (int i = 0; i < sk->w * sk->h; ++i) {
		if (sk->tbl[i]->max_value >= thresh) {
			dyn_tbl_get_heavy_key(sk->tbl[i], thresh, tmp_keys, &tmp_n);
			for (int j = 0; j < tmp_n; j++) {
				// deduplicate
				int k = 0;
				for (; k < n; k++) {
					if (memcmp(tmp_keys + j * sk->lgn / 8, keys + k * sk->lgn / 8,
						sk->lgn / 8) == 0) {
						break;
					}
				}
				if (k < n) {
					break;
				}

				long long v = LDSketch_up_estimate(sk, tmp_keys + j * sk->lgn / 8);
				if (v >= thresh) {
					memcpy(keys + n * sk->lgn / 8, tmp_keys + j * sk->lgn / 8,
						sk->lgn / 8);
					vals[n] = v;
					n++;
				}
			}
		}
	}

	*num_key = n;
}